

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O2

bool testing::internal::TuplePrefix<2ul>::
     Matches<std::tuple<testing::Matcher<ot::commissioner::BbrDataset&>,testing::Matcher<unsigned_short>>,std::tuple<ot::commissioner::BbrDataset&,unsigned_short>>
               (tuple<testing::Matcher<ot::commissioner::BbrDataset_&>,_testing::Matcher<unsigned_short>_>
                *matcher_tuple,tuple<ot::commissioner::BbrDataset_&,_unsigned_short> *value_tuple)

{
  bool bVar1;
  
  bVar1 = TuplePrefix<1ul>::
          Matches<std::tuple<testing::Matcher<ot::commissioner::BbrDataset&>,testing::Matcher<unsigned_short>>,std::tuple<ot::commissioner::BbrDataset&,unsigned_short>>
                    (matcher_tuple,value_tuple);
  if (bVar1) {
    bVar1 = MatcherBase<unsigned_short>::Matches
                      ((MatcherBase<unsigned_short> *)matcher_tuple,(unsigned_short *)value_tuple);
    return bVar1;
  }
  return false;
}

Assistant:

static bool Matches(const MatcherTuple& matcher_tuple,
                      const ValueTuple& value_tuple) {
    return TuplePrefix<N - 1>::Matches(matcher_tuple, value_tuple) &&
           std::get<N - 1>(matcher_tuple).Matches(std::get<N - 1>(value_tuple));
  }